

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall TTD::EventLog::RecordEmitLogEvent(EventLog *this,JavascriptString *uriString)

{
  charcount_t cVar1;
  uint32 uVar2;
  Memory *this_00;
  char *pcVar3;
  utf8char_t *dest;
  char16 *source;
  size_t sVar4;
  size_t uriLength;
  TrackAllocData local_58;
  undefined1 local_30 [8];
  AutoArrayPtr<char> uri;
  size_t cbUri;
  JavascriptString *uriString_local;
  EventLog *this_local;
  
  RecordGetInitializedEvent_DataOnly<TTD::NSLogEvents::ExplicitLogWriteEventLogEntry,(TTD::NSLogEvents::EventKind)13>
            (this);
  cVar1 = Js::JavascriptString::GetLength(uriString);
  uVar2 = UInt32Math::Mul<3u>(cVar1);
  uri.m_elementCount = (size_t)uVar2;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&char::typeinfo,0,uri.m_elementCount,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTEventLog.cpp"
             ,0x364);
  this_00 = (Memory *)
            Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_58);
  pcVar3 = Memory::AllocateArray<Memory::HeapAllocator,char,false>
                     (this_00,(HeapAllocator *)Memory::HeapAllocator::AllocZero,0,uri.m_elementCount
                     );
  AutoArrayPtr<char>::AutoArrayPtr((AutoArrayPtr<char> *)local_30,pcVar3,uri.m_elementCount);
  dest = (utf8char_t *)BasePtr::operator_cast_to_char_((BasePtr *)local_30);
  sVar4 = uri.m_elementCount;
  source = Js::JavascriptString::GetString(uriString);
  cVar1 = Js::JavascriptString::GetLength(uriString);
  sVar4 = utf8::EncodeInto<(utf8::Utf8EncodingKind)0>(dest,sVar4,source,cVar1);
  pcVar3 = BasePtr::operator_cast_to_char_((BasePtr *)local_30);
  EmitLog(this,pcVar3,sVar4,(EventLogEntry *)0x0);
  AutoArrayPtr<char>::~AutoArrayPtr((AutoArrayPtr<char> *)local_30);
  return;
}

Assistant:

void EventLog::RecordEmitLogEvent(Js::JavascriptString* uriString)
    {
        this->RecordGetInitializedEvent_DataOnly<NSLogEvents::ExplicitLogWriteEventLogEntry, NSLogEvents::EventKind::ExplicitLogWriteTag>();

        size_t cbUri = UInt32Math::Mul<3>(uriString->GetLength());
        AutoArrayPtr<char> uri(HeapNewArrayZ(char, cbUri), cbUri);
        size_t uriLength = utf8::EncodeInto<utf8::Utf8EncodingKind::Cesu8>((LPUTF8)((char*)uri), cbUri, uriString->GetString(), uriString->GetLength());

        this->EmitLog(uri, uriLength);
    }